

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::LoopNode::Emit(LoopNode *this,Compiler *compiler,CharCount *skipped)

{
  CharCount CVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  CountDomain CVar5;
  CharSetNode *pCVar6;
  code *pcVar7;
  uint uVar8;
  bool bVar9;
  char16 cVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Label LVar14;
  undefined4 *puVar15;
  byte *pbVar16;
  Node *pNVar17;
  uint8 *puVar18;
  uint8 *puVar19;
  CharSet<char16_t> *pCVar20;
  ArenaAllocator *allocator;
  RuntimeCharSet<char16_t> *pRVar21;
  CharCount CVar22;
  Label *pLVar23;
  undefined4 local_44;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  int maxBodyGroupId;
  uint local_34 [2];
  int minBodyGroupId;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xf49,"(skipped == 0)","skipped == 0");
    if (!bVar9) goto LAB_00eb53c8;
    *puVar15 = 0;
  }
  switch(this->scheme) {
  case BeginEnd:
    local_34[0] = (uint)compiler->program->numGroups;
    local_44 = 0xffffffff;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext,local_34,&local_44);
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    puVar19 = Compiler::Emit(compiler,0x1c);
    iVar13 = compiler->nextLoopId;
    compiler->nextLoopId = iVar13 + 1;
    uVar11 = *(uint *)&(this->super_Node).field_0xc;
    uVar3 = *(uint *)&this->body->field_0xc;
    bVar9 = this->isGreedy;
    *puVar19 = 'D';
    *(int *)(puVar19 + 1) = iVar13;
    CVar5 = this->repeats;
    puVar19[0xd] = (uVar11 >> 10 & 1) == 0;
    *(CountDomain *)(puVar19 + 5) = CVar5;
    puVar19[0xe] = (uVar3 >> 9 & 1) == 0;
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(uint *)(puVar19 + 0x13) = local_34[0];
    *(undefined4 *)(puVar19 + 0x17) = local_44;
    puVar19[0x1b] = bVar9;
    if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    LVar14 = (int)puVar18 - (int)compiler->instBuf;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    pbVar16 = Compiler::Emit(compiler,5);
    *pbVar16 = 0x45;
    goto LAB_00eb4e24;
  default:
    goto switchD_00eb3d1b_caseD_1;
  case Chomp:
    uVar11 = (this->repeats).lower;
    bVar9 = (this->repeats).upper != 0xffffffff;
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      if (bVar9 || 1 < uVar11) {
        puVar18 = Compiler::Emit(compiler,0xb);
        cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
        *puVar18 = 'Z';
        *(char16 *)(puVar18 + 1) = cVar10;
        *(CountDomain *)(puVar18 + 3) = this->repeats;
        return;
      }
      puVar18 = Compiler::Emit(compiler,3);
      cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
      if (uVar11 == 0) {
        *puVar18 = 'R';
      }
      else {
        *puVar18 = 'S';
      }
LAB_00eb4b25:
      *(char16 *)(puVar18 + 1) = cVar10;
      return;
    }
    if (!bVar9 && 1 >= uVar11) {
      puVar18 = Compiler::Emit(compiler,0x29);
      pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      if (uVar11 == 0) {
        *puVar18 = 'T';
      }
      else {
        *puVar18 = 'U';
      }
      goto LAB_00eb4d06;
    }
    puVar18 = Compiler::Emit(compiler,0x31);
    *puVar18 = '[';
    pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
    *(CountDomain *)(puVar18 + 0x29) = this->repeats;
    allocator = compiler->rtAllocator;
    goto LAB_00eb4e8b;
  case ChompGroupLastChar:
    if (this->body->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xf91,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    pNVar17 = this->body;
    puVar18 = Compiler::Emit(compiler,0x36);
    uVar2 = *(undefined4 *)&pNVar17[1].tag;
    bVar9 = this->noNeedToSave;
    *puVar18 = '\\';
    pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
    *(CountDomain *)(puVar18 + 0x29) = this->repeats;
    *(undefined4 *)(puVar18 + 0x31) = uVar2;
    puVar18[0x35] = bVar9;
    allocator = compiler->rtAllocator;
LAB_00eb4e8b:
    pNVar17 = this->body;
LAB_00eb4e8f:
    pCVar20 = pNVar17->firstSet;
LAB_00eb4e96:
    RuntimeCharSet<char16_t>::CloneFrom(pRVar21,allocator,pCVar20);
    return;
  case Guarded:
    local_34[0] = (uint)compiler->program->numGroups;
    local_44 = 0xffffffff;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext);
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      puVar19 = Compiler::Emit(compiler,0x1d);
      cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
      iVar13 = compiler->nextLoopId;
      compiler->nextLoopId = iVar13 + 1;
      uVar11 = *(uint *)&(this->super_Node).field_0xc;
      uVar3 = *(uint *)&this->body->field_0xc;
      *puVar19 = 'F';
      *(char16 *)(puVar19 + 1) = cVar10;
      *(int *)(puVar19 + 3) = iVar13;
      CVar5 = this->repeats;
      puVar19[0xf] = (uVar11 >> 10 & 1) == 0;
      *(CountDomain *)(puVar19 + 7) = CVar5;
      puVar19[0x10] = (uVar3 >> 9 & 1) == 0;
      puVar18 = puVar19 + 0x11;
      puVar19[0x11] = 0xff;
      puVar19[0x12] = 0xff;
      puVar19[0x13] = 0xff;
      puVar19[0x14] = 0xff;
      *(uint *)(puVar19 + 0x15) = local_34[0];
      *(undefined4 *)(puVar19 + 0x19) = local_44;
      if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
joined_r0x00eb4ddb:
        if (!bVar9) goto LAB_00eb53c8;
        *puVar15 = 0;
      }
    }
    else {
      puVar19 = Compiler::Emit(compiler,0x43);
      uVar8 = local_34[0];
      uVar2 = local_44;
      iVar13 = compiler->nextLoopId;
      compiler->nextLoopId = iVar13 + 1;
      uVar11 = *(uint *)&(this->super_Node).field_0xc;
      uVar3 = *(uint *)&this->body->field_0xc;
      *puVar19 = 'G';
      RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar19 + 1));
      *(int *)(puVar19 + 0x29) = iVar13;
      CVar5 = this->repeats;
      puVar19[0x35] = (uVar11 >> 10 & 1) == 0;
      *(CountDomain *)(puVar19 + 0x2d) = CVar5;
      puVar19[0x36] = (uVar3 >> 9 & 1) == 0;
      puVar18 = puVar19 + 0x37;
      puVar19[0x37] = 0xff;
      puVar19[0x38] = 0xff;
      puVar19[0x39] = 0xff;
      puVar19[0x3a] = 0xff;
      *(uint *)(puVar19 + 0x3b) = uVar8;
      *(undefined4 *)(puVar19 + 0x3f) = uVar2;
      RuntimeCharSet<char16_t>::CloneFrom
                ((RuntimeCharSet<char16_t> *)(puVar19 + 1),compiler->rtAllocator,
                 this->body->firstSet);
      if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        goto joined_r0x00eb4ddb;
      }
    }
    LVar14 = (int)puVar18 - (int)compiler->instBuf;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    sVar4 = (this->body->firstSet->rep).compact.countPlusOne;
    pbVar16 = Compiler::Emit(compiler,5);
    *pbVar16 = sVar4 == 2 ^ 0x49;
LAB_00eb4e24:
    *(CharCount *)(pbVar16 + 1) = _uStack_40;
    break;
  case Fixed:
    if ((this->body->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc1,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->thisConsumes).lower != (this->body->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc2,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->thisConsumes).lower == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc3,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc4,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    CVar22 = compiler->instNext;
    puVar19 = Compiler::Emit(compiler,0x17);
    iVar13 = compiler->nextLoopId;
    compiler->nextLoopId = iVar13 + 1;
    uVar11 = *(uint *)&(this->super_Node).field_0xc;
    CVar1 = (this->body->thisConsumes).lower;
    *puVar19 = 'J';
    *(int *)(puVar19 + 1) = iVar13;
    *(CountDomain *)(puVar19 + 5) = this->repeats;
    puVar19[0xd] = (uVar11 >> 10 & 1) == 0;
    puVar19[0xe] = '\0';
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(CharCount *)(puVar19 + 0x13) = CVar1;
    if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
      _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,CVar22);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
      CVar22 = _uStack_40;
    }
    LVar14 = (int)puVar18 - (int)compiler->instBuf;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'K';
    *(CharCount *)(puVar18 + 1) = CVar22;
    break;
  case FixedSet:
    pNVar17 = this->body;
    if (((((pNVar17->features & 0x110e) != 0) || ((*(uint *)&pNVar17->field_0xc & 2) != 0)) ||
        ((*(uint *)&pNVar17->field_0xc & 1) == 0)) ||
       (((pNVar17->thisConsumes).lower != 1 || ((pNVar17->thisConsumes).upper != 1)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfd4,"(body->IsSimpleOneChar())","body->IsSimpleOneChar()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->followFirst == L'\xffff') ||
       (bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,RegexOptBTPhase), bVar9)) {
      puVar18 = Compiler::Emit(compiler,0x36);
      iVar13 = compiler->nextLoopId;
      compiler->nextLoopId = iVar13 + 1;
      uVar11 = *(uint *)&(this->super_Node).field_0xc;
      *puVar18 = 'L';
      pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
      *(int *)(puVar18 + 0x29) = iVar13;
      *(CountDomain *)(puVar18 + 0x2d) = this->repeats;
      puVar18[0x35] = (uVar11 >> 10 & 1) == 0;
    }
    else {
      puVar18 = Compiler::Emit(compiler,0x38);
      iVar13 = compiler->nextLoopId;
      compiler->nextLoopId = iVar13 + 1;
      uVar11 = *(uint *)&(this->super_Node).field_0xc;
      _uStack_40 = (LoopNode *)CONCAT62(uStack_3e,this->followFirst);
      *puVar18 = 'M';
      pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
      *(int *)(puVar18 + 0x29) = iVar13;
      *(CountDomain *)(puVar18 + 0x2d) = this->repeats;
      puVar18[0x35] = (uVar11 >> 10 & 1) == 0;
      *(undefined2 *)(puVar18 + 0x36) = uStack_40;
    }
    allocator = compiler->rtAllocator;
    pNVar17 = this->body;
    goto LAB_00eb4e8f;
  case FixedGroupLastIteration:
    if (this->body->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfea,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    pNVar17 = this->body;
    if ((pNVar17->thisConsumes).lower != (pNVar17->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfec,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->thisConsumes).lower == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfed,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfee,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    _uStack_40 = (LoopNode *)CONCAT44(maxBodyGroupId,compiler->instNext);
    puVar19 = Compiler::Emit(compiler,0x1c);
    iVar13 = compiler->nextLoopId;
    compiler->nextLoopId = iVar13 + 1;
    uVar11 = *(uint *)&(this->super_Node).field_0xc;
    CVar22 = (this->body->thisConsumes).lower;
    uVar2 = *(undefined4 *)&pNVar17[1].tag;
    bVar9 = this->noNeedToSave;
    *puVar19 = 'N';
    *(int *)(puVar19 + 1) = iVar13;
    *(CountDomain *)(puVar19 + 5) = this->repeats;
    puVar19[0xd] = (uVar11 >> 10 & 1) == 0;
    puVar19[0xe] = '\0';
    puVar18 = puVar19 + 0xf;
    puVar19[0xf] = 0xff;
    puVar19[0x10] = 0xff;
    puVar19[0x11] = 0xff;
    puVar19[0x12] = 0xff;
    *(CharCount *)(puVar19 + 0x13) = CVar22;
    *(undefined4 *)(puVar19 + 0x17) = uVar2;
    puVar19[0x1b] = bVar9;
    if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    uVar11 = (int)puVar18 - (int)compiler->instBuf;
    (**(code **)(*pNVar17[1]._vptr_Node + 0x88))(pNVar17[1]._vptr_Node,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'O';
    *(CharCount *)(puVar18 + 1) = _uStack_40;
    goto LAB_00eb4f7c;
  case GreedyNoBacktrack:
    if ((this->body->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1001,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if (this->isGreedy == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1002,"(isGreedy)","isGreedy");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->repeats).lower != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1003,"(repeats.lower == 0)","repeats.lower == 0");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->repeats).upper != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1004,"(repeats.upper == CharCountFlag)","repeats.upper == CharCountFlag"
                        );
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1005,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    CVar22 = compiler->instNext;
    puVar18 = Compiler::Emit(compiler,9);
    iVar13 = compiler->nextLoopId;
    compiler->nextLoopId = iVar13 + 1;
    *puVar18 = 'P';
    *(int *)(puVar18 + 1) = iVar13;
    puVar18 = puVar18 + 5;
    if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x272,"((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                         ,"(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    uVar11 = (int)puVar18 - (int)compiler->instBuf;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar18 = Compiler::Emit(compiler,5);
    *puVar18 = 'Q';
    *(CharCount *)(puVar18 + 1) = CVar22;
    goto LAB_00eb4f7c;
  case Set:
    if (((this->body->features & 0x100) != 0) && ((this->body->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1015,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      puVar18 = Compiler::Emit(compiler,3);
      cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
      *puVar18 = '#';
      goto LAB_00eb4b25;
    }
    puVar18 = Compiler::Emit(compiler,0x29);
    *puVar18 = '$';
    pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
LAB_00eb4d06:
    RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
    allocator = compiler->rtAllocator;
    pCVar20 = this->body->firstSet;
    goto LAB_00eb4e96;
  case Chain:
    if (((this->body->features & 0x100) != 0) && ((this->body->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1027,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    local_34[0] = 0;
    pNVar17 = this->body;
    sVar4 = (pNVar17->firstSet->rep).compact.countPlusOne;
    iVar13 = (*pNVar17->_vptr_Node[0xb])(pNVar17,compiler);
    if (sVar4 != 2) {
      _uStack_40 = this;
      puVar18 = Compiler::Emit(compiler,0x2d);
      pRVar21 = (RuntimeCharSet<char16_t> *)(puVar18 + 1);
      puVar19 = puVar18 + 0x29;
      if ((char)iVar13 == '\0') {
        *puVar18 = '\x06';
        RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
        this = _uStack_40;
        puVar18[0x29] = 0xff;
        puVar18[0x2a] = 0xff;
        puVar18[0x2b] = 0xff;
        puVar18[0x2c] = 0xff;
        RuntimeCharSet<char16_t>::CloneFrom
                  (pRVar21,compiler->rtAllocator,_uStack_40->body->firstSet);
        puVar18 = compiler->instBuf;
        if (puVar18 <= puVar19) goto LAB_00eb4f04;
        goto LAB_00eb4f0f;
      }
      *puVar18 = '\a';
      RuntimeCharSet<char16_t>::RuntimeCharSet(pRVar21);
      this = _uStack_40;
      puVar18[0x29] = 0xff;
      puVar18[0x2a] = 0xff;
      puVar18[0x2b] = 0xff;
      puVar18[0x2c] = 0xff;
      RuntimeCharSet<char16_t>::CloneFrom(pRVar21,compiler->rtAllocator,_uStack_40->body->firstSet);
      puVar18 = compiler->instBuf;
      if (puVar18 <= puVar19) goto LAB_00eb4c82;
      goto LAB_00eb4c8d;
    }
    puVar18 = Compiler::Emit(compiler,7);
    cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
    puVar19 = puVar18 + 3;
    if ((char)iVar13 == '\0') {
      *puVar18 = '\x04';
      *(char16 *)(puVar18 + 1) = cVar10;
      puVar18[3] = 0xff;
      puVar18[4] = 0xff;
      puVar18[5] = 0xff;
      puVar18[6] = 0xff;
      puVar18 = compiler->instBuf;
      if (puVar19 < puVar18) {
LAB_00eb4f0f:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar9) goto LAB_00eb53c8;
        *puVar15 = 0;
      }
      else {
LAB_00eb4f04:
        if (puVar18 + compiler->instNext <= puVar19) goto LAB_00eb4f0f;
      }
      uVar11 = (int)puVar19 - (int)compiler->instBuf;
    }
    else {
      *puVar18 = '\x05';
      *(char16 *)(puVar18 + 1) = cVar10;
      puVar18[3] = 0xff;
      puVar18[4] = 0xff;
      puVar18[5] = 0xff;
      puVar18[6] = 0xff;
      puVar18 = compiler->instBuf;
      if (puVar19 < puVar18) {
LAB_00eb4c8d:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar9) goto LAB_00eb53c8;
        *puVar15 = 0;
      }
      else {
LAB_00eb4c82:
        if (puVar18 + compiler->instNext <= puVar19) goto LAB_00eb4c8d;
      }
      uVar11 = (int)puVar19 - (int)compiler->instBuf;
      local_34[0] = 1;
    }
    (*this->body->_vptr_Node[0x11])(this->body,compiler,local_34);
LAB_00eb4f7c:
    uVar3 = compiler->instNext;
    if (uVar3 <= uVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                         ,0x278,"(fixup < instNext)","fixup < instNext");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    if (uVar3 <= compiler->instNext) {
LAB_00eb5035:
      *(uint *)(compiler->instBuf + uVar11) = uVar3;
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                       ,0x279,"(label <= instNext)","label <= instNext");
    if (bVar9) {
      *puVar15 = 0;
      goto LAB_00eb5035;
    }
    goto LAB_00eb53c8;
  case Try:
    if (((this->body->features & 0x100) != 0) && ((this->body->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1052,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar9) goto LAB_00eb53c8;
      *puVar15 = 0;
    }
    local_34[0] = 0;
    pNVar17 = this->body;
    if ((pNVar17->thisConsumes).lower == 0) {
LAB_00eb5175:
      puVar18 = Compiler::Emit(compiler,5);
      *puVar18 = ']';
      puVar18[1] = 0xff;
      puVar18[2] = 0xff;
      puVar18[3] = 0xff;
      puVar18[4] = 0xff;
      puVar18 = puVar18 + 1;
      if ((puVar18 < compiler->instBuf) || (compiler->instBuf + compiler->instNext <= puVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar9) goto LAB_00eb53c8;
        *puVar15 = 0;
      }
      LVar14 = (int)puVar18 - *(int *)&compiler->instBuf;
    }
    else {
      if ((pNVar17->field_0xc & 1) == 0) {
        pCVar20 = pNVar17->firstSet;
        sVar4 = (pCVar20->rep).compact.countPlusOne;
        if (sVar4 - 1 < 5) {
          uVar11 = (int)sVar4 - 1;
        }
        else {
          pCVar6 = (pCVar20->rep).full.root;
          if (pCVar6 == (CharSetNode *)0x0) {
            uVar11 = CharBitvec::Count(&(pCVar20->rep).full.direct);
          }
          else {
            if ((pCVar6 != (CharSetNode *)&CharSetFull::Instance) &&
               (uVar11 = (*pCVar6->_vptr_CharSetNode[0xb])(pCVar6,2), 0xff00 < uVar11)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar15 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar9) goto LAB_00eb53c8;
              *puVar15 = 0;
            }
            uVar12 = CharBitvec::Count(&(pCVar20->rep).full.direct);
            pCVar6 = (pCVar20->rep).full.root;
            if (pCVar6 == (CharSetNode *)&CharSetFull::Instance) {
              iVar13 = 0xff00;
            }
            else {
              iVar13 = (*pCVar6->_vptr_CharSetNode[0xb])(pCVar6,2);
            }
            uVar11 = iVar13 + uVar12;
          }
        }
        if (0x14 < uVar11) goto LAB_00eb5175;
      }
      iVar13 = (*this->body->_vptr_Node[0xb])(this->body,compiler);
      sVar4 = (this->body->firstSet->rep).compact.countPlusOne;
      if ((char)iVar13 == '\0') {
        if (sVar4 == 2) {
          puVar18 = Compiler::Emit(compiler,7);
          cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
          *puVar18 = '^';
          *(char16 *)(puVar18 + 1) = cVar10;
          puVar18[3] = 0xff;
          puVar18[4] = 0xff;
          puVar18[5] = 0xff;
          puVar18[6] = 0xff;
          pLVar23 = (Label *)(puVar18 + 3);
        }
        else {
          puVar18 = Compiler::Emit(compiler,0x2d);
          *puVar18 = '`';
          RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar18 + 1));
          puVar18[0x29] = 0xff;
          puVar18[0x2a] = 0xff;
          puVar18[0x2b] = 0xff;
          puVar18[0x2c] = 0xff;
          pLVar23 = (Label *)(puVar18 + 0x29);
          RuntimeCharSet<char16_t>::CloneFrom
                    ((RuntimeCharSet<char16_t> *)(puVar18 + 1),compiler->rtAllocator,
                     this->body->firstSet);
        }
        LVar14 = Compiler::GetFixup(compiler,pLVar23);
      }
      else {
        if (sVar4 == 2) {
          puVar18 = Compiler::Emit(compiler,7);
          cVar10 = CharSet<char16_t>::Singleton(this->body->firstSet);
          *puVar18 = '_';
          *(char16 *)(puVar18 + 1) = cVar10;
          puVar18[3] = 0xff;
          puVar18[4] = 0xff;
          puVar18[5] = 0xff;
          puVar18[6] = 0xff;
          pLVar23 = (Label *)(puVar18 + 3);
        }
        else {
          puVar18 = Compiler::Emit(compiler,0x2d);
          *puVar18 = 'a';
          RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar18 + 1));
          puVar18[0x29] = 0xff;
          puVar18[0x2a] = 0xff;
          puVar18[0x2b] = 0xff;
          puVar18[0x2c] = 0xff;
          pLVar23 = (Label *)(puVar18 + 0x29);
          RuntimeCharSet<char16_t>::CloneFrom
                    ((RuntimeCharSet<char16_t> *)(puVar18 + 1),compiler->rtAllocator,
                     this->body->firstSet);
        }
        LVar14 = Compiler::GetFixup(compiler,pLVar23);
        local_34[0] = 1;
      }
    }
    (*this->body->_vptr_Node[0x11])(this->body,compiler,local_34);
  }
  uVar11 = compiler->instNext;
  if (uVar11 <= LVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                       ,0x278,"(fixup < instNext)","fixup < instNext");
    if (!bVar9) goto LAB_00eb53c8;
    *puVar15 = 0;
  }
  if (compiler->instNext < uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                       ,0x279,"(label <= instNext)","label <= instNext");
    if (!bVar9) {
LAB_00eb53c8:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar15 = 0;
  }
  *(uint *)(compiler->instBuf + LVar14) = uVar11;
switchD_00eb3d1b_caseD_1:
  return;
}

Assistant:

void LoopNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);

        switch (scheme)
        {
            case BeginEnd:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoop Lexit
                //          <loop body>
                //          RepeatLoop Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId, isGreedy)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case None:
            {
                // Nothing to emit
                break;
            }

            case Chomp:
            {
                //
                // Compilation scheme:
                //
                //   Chomp(Char|Set)(Star|Plus|Bounded)
                //
                if(body->firstSet->IsSingleton())
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompCharInst<ChompMode::Star>, body->firstSet->Singleton());
                        else
                            EMIT(compiler, ChompCharInst<ChompMode::Plus>, body->firstSet->Singleton());
                    }
                    else
                        EMIT(compiler, ChompCharBoundedInst, body->firstSet->Singleton(), repeats);
                }
                else
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompSetInst<ChompMode::Star>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        else
                            EMIT(compiler, ChompSetInst<ChompMode::Plus>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    }
                    else
                        EMIT(compiler, ChompSetBoundedInst, repeats)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case ChompGroupLastChar:
            {
                //
                // Compilation scheme:
                //
                //   ChompSetGroup
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                EMIT(compiler, ChompSetBoundedGroupLastCharInst, repeats, bodyGroup->groupId, noNeedToSave)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Guarded:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopIf(Char|Set) Lexit
                //          <loop body>
                //          RepeatLoopIf(Char|Set) Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label exitFixup;
                if (body->firstSet->IsSingleton())
                    exitFixup = compiler.GetFixup(&EMIT(compiler, BeginLoopIfCharInst, body->firstSet->Singleton(), compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId)->exitLabel);
                else
                {
                    BeginLoopIfSetInst* i = EMIT(compiler, BeginLoopIfSetInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId);
                    i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    exitFixup = compiler.GetFixup(&i->exitLabel);
                }
                body->Emit(compiler, skipped);
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, RepeatLoopIfCharInst, beginLabel);
                else
                    EMIT(compiler, RepeatLoopIfSetInst, beginLabel);
                compiler.DoFixup(exitFixup, compiler.CurrentLabel());
                break;
            }

            case Fixed:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixed Lexit
                //          <loop body>
                //          RepeatLoopFixed Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case FixedSet:
            {
                //
                // Compilation scheme:
                //
                //   LoopSet
                //
                Assert(body->IsSimpleOneChar());
                if (followFirst == MaxChar || PHASE_OFF1(Js::RegexOptBTPhase))
                {
                    EMIT(compiler, LoopSetInst, compiler.NextLoopId(), repeats, !isNotInLoop)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                else
                {
                    EMIT(compiler, LoopSetWithFollowFirstInst, compiler.NextLoopId(), repeats, !isNotInLoop, followFirst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case FixedGroupLastIteration:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixedGroupLastIteration Lexit
                //          <loop body>
                //          RepeatLoopFixedGroupLastIteration Lloop
                //   Lexit:
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedGroupLastIterationInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower, bodyGroup->groupId, noNeedToSave)->exitLabel);
                bodyGroup->body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedGroupLastIterationInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case GreedyNoBacktrack:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginGreedyLoopNoBacktrack Lexit
                //          <loop body>
                //          RepeatGreedyLoopNoBacktrack Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(isGreedy);
                Assert(repeats.lower == 0);
                Assert(repeats.upper == CharCountFlag);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginGreedyLoopNoBacktrackInst, compiler.NextLoopId())->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatGreedyLoopNoBacktrackInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case Set:
            {
                //
                // Compilation scheme:
                //
                //   OptMatch(Char|Set)
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, OptMatchCharInst, body->firstSet->Singleton());
                else
                    EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Chain:
            {
                //
                // Compilation scheme:
                //
                //          JumpIfNot(Char|Set) Lexit
                //          <body>
                //   Lexit:
                //
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label jumpFixup = 0;
                CharCount bodySkipped = 0;
                if (body->firstSet->IsSingleton())
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, body->firstSet->Singleton())->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, body->firstSet->Singleton())->targetLabel);
                }
                else
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                    {
                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                    }
                }
                body->Emit(compiler, bodySkipped);
                compiler.DoFixup(jumpFixup, compiler.CurrentLabel());
                break;
            }

            case Try:
            {
                //
                // Compilation scheme:
                //
                //          Try((If|Match)(Char|Set))? Lexit
                //          <loop body>
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label tryFixup = 0;
                CharCount bodySkipped = 0;
                // HEURISTIC: if the first set of the body is exact or small, and the
                //            body does not match empty, then it's probably worth using
                //            a Try(If|Match)(Char|Set)
                if (!body->thisConsumes.CouldMatchEmpty() &&
                    (body->isFirstExact || body->firstSet->Count() <= maxCharsForConditionalTry))
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        if (body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                        bodySkipped = 1;
                    }
                    else
                    {
                        if(body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                    }
                }
                else
                    tryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                body->Emit(compiler, bodySkipped);
                // Fixup Try
                compiler.DoFixup(tryFixup, compiler.CurrentLabel());
                break;
            }
        }
    }